

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosYAML.cpp
# Opt level: O3

void adios2::helper::ParseConfigYAMLIO
               (ADIOS *adios,string *configFileYAML,string *configFileContents,IO *io)

{
  pointer pcVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  int iVar4;
  long *plVar5;
  size_type *psVar6;
  _Alloc_hider *p_Var7;
  value vVar8;
  size_type sVar9;
  ADIOS *adios_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  node **ppnVar10;
  bool bVar11;
  const_iterator itNode;
  string ioName;
  string hint;
  Node ioScalar;
  string configFileContentsCopy;
  Node document;
  _Alloc_hider local_268;
  SeqIter SStack_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  element_type *local_248;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_240;
  IO *local_238;
  string local_230;
  string local_210;
  Node local_1f0;
  undefined1 local_1b0 [224];
  Node local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  char local_80 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Alloc_hider local_60;
  size_type sStack_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  char local_40 [16];
  
  local_238 = io;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                 "when parsing config file ",configFileYAML);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_1b0);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_210.field_2._M_allocated_capacity = *psVar6;
    local_210.field_2._8_8_ = plVar5[3];
  }
  else {
    local_210.field_2._M_allocated_capacity = *psVar6;
    local_210._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_210._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  pcVar1 = local_1b0 + 0x10;
  if ((pointer)local_1b0._0_8_ != pcVar1) {
    operator_delete((void *)local_1b0._0_8_);
  }
  local_1b0._192_8_ = local_1b0 + 0xd0;
  pcVar2 = (configFileContents->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_1b0 + 0xc0),pcVar2,pcVar2 + configFileContents->_M_string_length);
  YAML::Load(&local_d0,(string *)(local_1b0 + 0xc0));
  if ((local_d0.m_isValid != true) ||
     ((local_d0.m_pNode != (node *)0x0 &&
      ((((((local_d0.m_pNode)->m_pRef).
          super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_pData).
        super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_isDefined
       == false)))) {
    local_1b0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Helper","");
    local_1f0._0_8_ = (pointer)((long)&local_1f0 + 0x10U);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"adiosYAML","");
    local_268._M_p = (pointer)&local_258;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"ParseConfigYAML","");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
                   "parser error in file ",configFileYAML);
    plVar5 = (long *)std::__cxx11::string::append(local_50._M_local_buf);
    p_Var7 = (_Alloc_hider *)(plVar5 + 2);
    if ((_Alloc_hider *)*plVar5 == p_Var7) {
      local_60._M_p = p_Var7->_M_p;
      sStack_58 = plVar5[3];
      local_70._M_allocated_capacity = (size_type)&local_60;
    }
    else {
      local_60._M_p = p_Var7->_M_p;
      local_70._M_allocated_capacity = (size_type)(_Alloc_hider *)*plVar5;
    }
    local_70._8_8_ = plVar5[1];
    *plVar5 = (long)p_Var7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               (local_70._M_local_buf,(ulong)local_210._M_dataplus._M_p);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_230.field_2._M_allocated_capacity = *psVar6;
      local_230.field_2._8_8_ = plVar5[3];
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    }
    else {
      local_230.field_2._M_allocated_capacity = *psVar6;
      local_230._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_230._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    Throw<std::invalid_argument>
              ((string *)local_1b0,(string *)&local_1f0,(string *)&local_268,&local_230,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    if ((_Alloc_hider *)local_70._M_allocated_capacity != &local_60) {
      operator_delete((void *)local_70._M_allocated_capacity);
    }
    if ((char *)local_50._M_allocated_capacity != local_40) {
      operator_delete((void *)local_50._M_allocated_capacity);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_p != &local_258) {
      operator_delete(local_268._M_p);
    }
    if ((pointer)local_1f0._0_8_ != (pointer)((long)&local_1f0 + 0x10U)) {
      operator_delete((void *)local_1f0._0_8_);
    }
    if ((pointer)local_1b0._0_8_ != pcVar1) {
      operator_delete((void *)local_1b0._0_8_);
    }
  }
  if (((local_d0.m_isValid & 1U) == 0) || (local_d0.m_pNode == (node *)0x0)) {
    local_268._M_p = local_268._M_p & 0xffffffff00000000;
    SStack_260._M_current = (node **)0x0;
    local_258._M_allocated_capacity = 0;
    local_258._8_8_ = 0;
    local_248 = (element_type *)0x0;
  }
  else {
    YAML::detail::node_data::begin
              ((node_iterator *)local_1b0,
               ((((local_d0.m_pNode)->m_pRef).
                 super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    local_248 = local_d0.m_pMemory.
                super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (local_d0.m_pMemory.
        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)
         ((long)local_d0.m_pMemory.
                super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi + 8) =
             *(_Atomic_word *)
              ((long)local_d0.m_pMemory.
                     super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 8) + 1;
        UNLOCK();
        if (__libc_single_threaded != '\0') goto LAB_0041c48a;
        LOCK();
        *(_Atomic_word *)
         ((long)local_d0.m_pMemory.
                super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi + 8) =
             *(_Atomic_word *)
              ((long)local_d0.m_pMemory.
                     super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)
         ((long)local_d0.m_pMemory.
                super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi + 8) =
             *(_Atomic_word *)
              ((long)local_d0.m_pMemory.
                     super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 8) + 1;
LAB_0041c48a:
        *(_Atomic_word *)
         ((long)local_d0.m_pMemory.
                super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi + 8) =
             *(_Atomic_word *)
              ((long)local_d0.m_pMemory.
                     super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 8) + 1;
      }
      local_240._M_pi =
           local_d0.m_pMemory.
           super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      local_258._8_8_ = local_1b0._24_8_;
      local_258._M_allocated_capacity = local_1b0._16_8_;
      SStack_260._M_current = (node **)local_1b0._8_8_;
      local_268._M_p = (pointer)local_1b0._0_8_;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d0.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      goto LAB_0041c014;
    }
    local_268._M_p = (pointer)local_1b0._0_8_;
    SStack_260._M_current = (node **)local_1b0._8_8_;
    local_258._M_allocated_capacity = local_1b0._16_8_;
    local_258._8_8_ = local_1b0._24_8_;
  }
  local_240._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0041c014:
  do {
    if ((local_d0.m_isValid == true) && (local_d0.m_pNode != (node *)0x0)) {
      YAML::detail::node_data::end
                ((node_iterator *)local_1b0,
                 ((((local_d0.m_pNode)->m_pRef).
                   super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      this._M_pi = local_d0.m_pMemory.
                   super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
      sVar9 = local_1b0._16_8_;
      ppnVar10 = (node **)local_1b0._8_8_;
      vVar8 = local_1b0._0_4_;
      if (local_d0.m_pMemory.
          super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        this._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)
           ((long)local_d0.m_pMemory.
                  super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi + 8) =
               *(_Atomic_word *)
                ((long)local_d0.m_pMemory.
                       super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 8) + 1;
          UNLOCK();
          if (__libc_single_threaded != '\0') {
            iVar4 = *(_Atomic_word *)
                     ((long)local_d0.m_pMemory.
                            super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi + 8);
            goto LAB_0041c0da;
          }
          LOCK();
          *(_Atomic_word *)
           ((long)local_d0.m_pMemory.
                  super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi + 8) =
               *(_Atomic_word *)
                ((long)local_d0.m_pMemory.
                       super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 8) + 1;
          UNLOCK();
        }
        else {
          iVar4 = *(_Atomic_word *)
                   ((long)local_d0.m_pMemory.
                          super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi + 8) + 1;
          *(int *)((long)local_d0.m_pMemory.
                         super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 8) = iVar4;
LAB_0041c0da:
          *(int *)((long)local_d0.m_pMemory.
                         super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 8) = iVar4 + 1;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d0.m_pMemory.
                   super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    else {
      sVar9 = 0;
      this._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      vVar8 = NoneType;
      ppnVar10 = (node **)0x0;
    }
    if ((value)local_268._M_p == vVar8) {
      if (vVar8 == Map) {
        bVar11 = local_258._M_allocated_capacity == sVar9;
      }
      else {
        bVar11 = true;
        if (vVar8 == Sequence) {
          bVar11 = SStack_260._M_current == ppnVar10;
        }
      }
    }
    else {
      bVar11 = false;
    }
    if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
    }
    if (bVar11) goto LAB_0041c3c4;
    local_90._M_allocated_capacity = (size_type)local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"IO","");
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator*
              ((value_type *)local_1b0,
               (iterator_base<const_YAML::detail::iterator_value> *)&local_268);
    anon_unknown_0::YAMLNode
              (&local_1f0,(string *)&local_90,(Node *)local_1b0,&local_210,false,Scalar);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._176_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._176_8_);
    }
    if ((undefined1 *)local_1b0._136_8_ != local_1b0 + 0x98) {
      operator_delete((void *)local_1b0._136_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._112_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._112_8_);
    }
    if ((undefined1 *)local_1b0._72_8_ != local_1b0 + 0x58) {
      operator_delete((void *)local_1b0._72_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._48_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._48_8_);
    }
    if (local_1b0._8_8_ != (long)local_1b0 + 0x18U) {
      operator_delete((void *)local_1b0._8_8_);
    }
    if ((char *)local_90._M_allocated_capacity != local_80) {
      operator_delete((void *)local_90._M_allocated_capacity);
    }
    if (((string)local_1f0.m_isValid == (string)0x1) &&
       ((local_1f0.m_pNode == (node *)0x0 ||
        ((((((local_1f0.m_pNode)->m_pRef).
            super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_pData)
          .super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         m_isDefined == true)))) {
      local_1b0._0_8_ = &local_1f0;
      YAML::
      as_if<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
      operator()(&local_230,
                 (as_if<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                  *)local_1b0);
      _Var3._M_p = local_230._M_dataplus._M_p;
      if ((local_230._M_string_length == (local_238->m_Name)._M_string_length) &&
         ((local_230._M_string_length == 0 ||
          (iVar4 = bcmp(local_230._M_dataplus._M_p,(local_238->m_Name)._M_dataplus._M_p,
                        local_230._M_string_length), iVar4 == 0)))) {
        adios_00 = (ADIOS *)local_1b0;
        YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator*
                  ((value_type *)adios_00,
                   (iterator_base<const_YAML::detail::iterator_value> *)&local_268);
        IOYAML(adios_00,(Node *)local_1b0,local_238,&local_210);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._176_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._176_8_);
        }
        if ((undefined1 *)local_1b0._136_8_ != local_1b0 + 0x98) {
          operator_delete((void *)local_1b0._136_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._112_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._112_8_);
        }
        if ((undefined1 *)local_1b0._72_8_ != local_1b0 + 0x58) {
          operator_delete((void *)local_1b0._72_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._48_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._48_8_);
        }
        if (local_1b0._8_8_ != (long)local_1b0 + 0x18U) {
          operator_delete((void *)local_1b0._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p);
        }
        if (local_1f0.m_pMemory.
            super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1f0.m_pMemory.
                     super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_1f0.m_invalidKey._M_dataplus._M_p != (pointer)((long)&local_1f0 + 0x18U)) {
          operator_delete(local_1f0.m_invalidKey._M_dataplus._M_p);
        }
LAB_0041c3c4:
        if (local_240._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_240._M_pi);
        }
        if (local_d0.m_pMemory.
            super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_d0.m_pMemory.
                     super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0.m_invalidKey._M_dataplus._M_p != &local_d0.m_invalidKey.field_2) {
          operator_delete(local_d0.m_invalidKey._M_dataplus._M_p);
        }
        if ((string *)local_1b0._192_8_ != (string *)(local_1b0 + 0xd0)) {
          operator_delete((void *)local_1b0._192_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p);
        }
        return;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var3._M_p != &local_230.field_2) {
        operator_delete(_Var3._M_p);
      }
    }
    if (local_1f0.m_pMemory.
        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1f0.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_1f0.m_invalidKey._M_dataplus._M_p != (pointer)((long)&local_1f0 + 0x18U)) {
      operator_delete(local_1f0.m_invalidKey._M_dataplus._M_p);
    }
    YAML::detail::node_iterator_base<YAML::detail::node>::operator++
              ((node_iterator_base<YAML::detail::node> *)&local_268);
  } while( true );
}

Assistant:

void ParseConfigYAMLIO(core::ADIOS &adios, const std::string &configFileYAML,
                       const std::string &configFileContents, core::IO &io)
{
    const std::string hint =
        "when parsing config file " + configFileYAML + " in call to ADIOS constructor";

    // the following copy is needed because YAML::Load modifies configFileContents
    const std::string configFileContentsCopy = configFileContents;
    const YAML::Node document = YAML::Load(configFileContentsCopy);

    if (!document)
    {
        helper::Throw<std::invalid_argument>(
            "Helper", "adiosYAML", "ParseConfigYAML",
            "parser error in file " + configFileYAML +
                " invalid format check with any YAML editor if format is "
                "ill-formed, " +
                hint);
    }

    for (auto itNode = document.begin(); itNode != document.end(); ++itNode)
    {
        const YAML::Node ioScalar =
            YAMLNode("IO", *itNode, hint, isNotMandatory, YAML::NodeType::Scalar);
        if (ioScalar)
        {
            const std::string ioName = ioScalar.as<std::string>();
            if (ioName == io.m_Name)
            {
                IOYAML(adios, *itNode, io, hint);
                return;
            }
        }
    }
}